

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O1

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceKeywords
          (string *__return_storage_ptr__,SQLLogicTestRunner *this,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Hash_node_base *p_Var5;
  string local_158;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  string *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  p_Var5 = (this->environment_variables)._M_h._M_before_begin._M_nxt;
  local_f8 = __return_storage_ptr__;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_f0[0] = local_e0;
      pcVar3 = (input->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar3,pcVar3 + input->_M_string_length);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"${%s}","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,p_Var5[1]._M_nxt,
                 (long)&(p_Var5[1]._M_nxt)->_M_nxt + (long)&(p_Var5[2]._M_nxt)->_M_nxt);
      StringUtil::Format<std::__cxx11::string>(&local_158,(StringUtil *)local_b0,&local_d0,in_RCX);
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 5);
      duckdb::StringUtil::Replace((string *)local_118,local_f0,&local_158);
      std::__cxx11::string::operator=((string *)input,(string *)local_118);
      if (local_118[0] != local_108) {
        operator_delete(local_118[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0]);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  pcVar3 = (input->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + input->_M_string_length);
  paVar2 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"__TEST_DIR__","");
  TestDirectoryPath_abi_cxx11_();
  duckdb::StringUtil::Replace(local_118,local_50,&local_158,local_138);
  std::__cxx11::string::operator=((string *)input,(string *)local_118);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pcVar3 = (input->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar3,pcVar3 + input->_M_string_length);
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"__WORKING_DIRECTORY__","");
  duckdb::FileSystem::GetWorkingDirectory_abi_cxx11_();
  duckdb::StringUtil::Replace(local_118,local_70,&local_158,local_138);
  std::__cxx11::string::operator=((string *)input,(string *)local_118);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  pcVar3 = (input->_M_dataplus)._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar3,pcVar3 + input->_M_string_length);
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"__BUILD_DIRECTORY__","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/build_O1","")
  ;
  duckdb::StringUtil::Replace(local_118,local_90,&local_158,local_138);
  std::__cxx11::string::operator=((string *)input,(string *)local_118);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  (local_f8->_M_dataplus)._M_p = (pointer)&local_f8->field_2;
  pcVar3 = (input->_M_dataplus)._M_p;
  paVar1 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&input->field_2 + 8);
    (local_f8->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_f8->field_2 + 8) = uVar4;
  }
  else {
    (local_f8->_M_dataplus)._M_p = pcVar3;
    (local_f8->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_f8->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar1;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return local_f8;
}

Assistant:

string SQLLogicTestRunner::ReplaceKeywords(string input) {
	// Replace environment variables in the SQL
	for (auto &it : environment_variables) {
		auto &name = it.first;
		auto &value = it.second;
		input = StringUtil::Replace(input, StringUtil::Format("${%s}", name), value);
	}
	input = StringUtil::Replace(input, "__TEST_DIR__", TestDirectoryPath());
	input = StringUtil::Replace(input, "__WORKING_DIRECTORY__", FileSystem::GetWorkingDirectory());
	input = StringUtil::Replace(input, "__BUILD_DIRECTORY__", DUCKDB_BUILD_DIRECTORY);
	return input;
}